

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

timestamp_t __thiscall
duckdb::TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (OriginWidthConvertibleToMonthsTernaryOperator *this,interval_t bucket_width,
          timestamp_t ts,timestamp_t origin)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  date_t input;
  timestamp_t input_00;
  int iVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  timestamp_t result;
  timestamp_t local_48;
  string local_40;
  
  input_00.value = bucket_width.micros;
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(input_00);
  if (!bVar1) {
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(input_00,&local_48,false);
    if (bVar1) {
      return (timestamp_t)local_48.value;
    }
    auVar8 = __cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
              (&local_40,(duckdb *)input_00.value,(timestamp_t)auVar8._8_8_);
    InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_40);
    __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar2 = EpochMonths<duckdb::timestamp_t>(input_00);
  iVar3 = EpochMonths<duckdb::timestamp_t>(ts);
  iVar6 = (int)this;
  iVar4 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar2,iVar3 % iVar6);
  iVar5 = iVar4 - iVar4 % iVar6;
  if (iVar4 % iVar6 != 0 && iVar4 < 0) {
    iVar5 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar5,iVar6);
  }
  iVar5 = iVar5 + iVar3 % iVar6;
  iVar4 = iVar5 % 0xc;
  if (iVar4 == 0 || -1 < iVar5) {
    iVar2 = iVar5 / 0xc + 0x7b2;
    iVar6 = 1;
    if (-1 < iVar5) goto LAB_01b3ee11;
  }
  else {
    iVar2 = 0x7b1 - (uint)-iVar5 / 0xc;
  }
  iVar6 = 0xd;
  if (iVar4 == 0) {
    iVar6 = 1;
  }
LAB_01b3ee11:
  input = Date::FromDate(iVar2,iVar6 + iVar4,1);
  bVar1 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(input,&local_48,false);
  if (bVar1) {
    return (timestamp_t)local_48.value;
  }
  auVar7 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
            (&local_40,(duckdb *)(ulong)(uint)input.days,(date_t)auVar7._8_4_);
  InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_40);
  __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(ts);
			int32_t origin_months = EpochMonths(origin);
			return Cast::template Operation<date_t, TR>(
			    WidthConvertibleToMonthsCommon(bucket_width.months, ts_months, origin_months));
		}